

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContextTlsEntry.h
# Opt level: O3

void __thiscall
ThreadContextScope::ThreadContextScope(ThreadContextScope *this,ThreadContext *threadContext)

{
  code *pcVar1;
  bool bVar2;
  ThreadContext *pTVar3;
  undefined4 *puVar4;
  ThreadContextTLSEntry *pTVar5;
  
  if (threadContext->isThreadBound == false) {
    pTVar5 = ThreadContextTLSEntry::GetEntryForCurrentThread();
    if (pTVar5 == (ThreadContextTLSEntry *)0x0) {
      pTVar3 = (ThreadContext *)0x0;
    }
    else {
      pTVar5 = ThreadContextTLSEntry::GetEntryForCurrentThread();
      pTVar3 = ThreadContextTLSEntry::GetThreadContext(pTVar5);
    }
    this->originalContext = pTVar3;
    this->wasInUse = pTVar3 == threadContext;
    bVar2 = ThreadContextTLSEntry::TrySetThreadContext(threadContext);
    this->isValid = bVar2;
    if (this->wasInUse != false) {
      bVar2 = false;
    }
  }
  else {
    pTVar3 = ThreadContext::GetContextForCurrentThread();
    if (pTVar3 != threadContext) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Base/ThreadContextTlsEntry.h"
                         ,0x35,"(ThreadContext::GetContextForCurrentThread() == threadContext)",
                         "ThreadContext::GetContextForCurrentThread() == threadContext");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    this->isValid = true;
    this->wasInUse = true;
    bVar2 = false;
  }
  this->doCleanup = bVar2;
  return;
}

Assistant:

ThreadContextScope(ThreadContext * threadContext)
    {
        if (!threadContext->IsThreadBound())
        {
            originalContext = ThreadContextTLSEntry::GetEntryForCurrentThread() ?
                ThreadContextTLSEntry::GetEntryForCurrentThread()->GetThreadContext() : NULL;
            wasInUse = threadContext == originalContext;
            isValid = ThreadContextTLSEntry::TrySetThreadContext(threadContext);
            doCleanup = !wasInUse && isValid;
        }
        else
        {
            Assert(ThreadContext::GetContextForCurrentThread() == threadContext);
            isValid = true;
            wasInUse = true;
            doCleanup = false;
        }
    }